

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O1

void skiwi::skiwi_repl(int argc,char **argv)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  undefined8 uVar8;
  size_type *psVar9;
  runtime_error *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char cVar11;
  ulong uVar12;
  bool bVar13;
  string command;
  string input;
  string filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  ulong local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  string local_f8;
  string local_d8;
  ulong local_b8;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if ((anonymous_namespace)::cd != '\x01') {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Skiwi is not initialized");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < argc) {
    uVar12 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,argv[uVar12],(allocator<char> *)&local_138);
      skiwi_runf(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      uVar12 = uVar12 + 1;
    } while ((uint)argc != uVar12);
  }
  if (DAT_002a9168 != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (DAT_002a9168,(anonymous_namespace)::welcome_message_abi_cxx11_,DAT_002a8e78);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_b8 = 0;
  do {
    poVar3 = DAT_002a9168;
    pcVar2 = (anonymous_namespace)::prompt_abi_cxx11_;
    if (DAT_002a9168 != (ostream *)0x0) {
      if ((anonymous_namespace)::prompt_abi_cxx11_ == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(*(long *)DAT_002a9168 + -0x18) + (int)DAT_002a9168);
      }
      else {
        sVar6 = strlen((anonymous_namespace)::prompt_abi_cxx11_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar6);
      }
    }
    cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_118,cVar4);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    bVar13 = false;
    lVar7 = std::__cxx11::string::find_first_not_of((char)local_70,0x20);
    if (lVar7 != -1) {
      bVar13 = *(char *)((long)local_70[0] + lVar7) == ',';
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (bVar13) {
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_90,local_88 + (long)local_90);
      cVar4 = (char)&local_d8;
      lVar7 = std::__cxx11::string::find_first_not_of(cVar4,0x20);
      if ((lVar7 == -1) || (local_d8._M_dataplus._M_p[lVar7] != ',')) {
        __assert_fail("is_cmd_command(txt)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/libskiwi.cpp"
                      ,0x25b,
                      "std::string skiwi::(anonymous namespace)::get_cleaned_command(std::string)");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::find_first_not_of((char)&local_90,0x20);
      std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_90);
      cVar11 = (char)(string *)&local_138;
      lVar7 = std::__cxx11::string::find(cVar11,0x20);
      if (lVar7 == -1) {
        local_158 = &local_148;
        if (local_138 == &local_128) {
          local_148._8_8_ = local_128._8_8_;
        }
        else {
          local_158 = local_138;
        }
        local_148._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
        local_148._M_local_buf[0] = local_128._M_local_buf[0];
        local_150 = local_130;
        local_130 = 0;
        local_128._M_local_buf[0] = '\0';
        local_138 = &local_128;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_158,(ulong)&local_138);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,
                        CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) +
                        1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (1 < local_150) {
        bVar1 = local_158->_M_local_buf[1];
        if (bVar1 < 0x65) {
          if (bVar1 == 0x3f) {
            iVar5 = std::__cxx11::string::compare((char *)&local_158);
            if ((iVar5 == 0) && (DAT_002a9168 != (ostream *)0x0)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (DAT_002a9168,(anonymous_namespace)::help_abi_cxx11_,DAT_002a8e58);
            }
          }
          else if ((bVar1 == 0x61) &&
                  (iVar5 = std::__cxx11::string::compare((char *)&local_158), iVar5 == 0)) {
            skiwi_show_assembly(&local_118);
          }
        }
        else if (bVar1 == 0x65) {
          iVar5 = std::__cxx11::string::compare((char *)&local_158);
          if (iVar5 == 0) {
            skiwi_show_environment();
          }
          else {
            uVar8 = std::__cxx11::string::compare((char *)&local_158);
            if ((int)uVar8 == 0) {
              local_b8 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_158);
              if (iVar5 == 0) {
                skiwi_show_expand(&local_118);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&local_158);
                if (iVar5 == 0) {
                  local_b0 = local_a0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_b0,local_118._M_dataplus._M_p,
                             local_118._M_dataplus._M_p + local_118._M_string_length);
                  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_d8,local_b0,local_a8 + (long)local_b0);
                  lVar7 = std::__cxx11::string::find_first_not_of(cVar4,0x20);
                  if ((lVar7 == -1) || (local_d8._M_dataplus._M_p[lVar7] != ',')) {
                    __assert_fail("is_cmd_command(txt)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/libskiwi.cpp"
                                  ,0x266,
                                  "std::string skiwi::(anonymous namespace)::get_cleaned_first_argument(std::string)"
                                 );
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                    operator_delete(local_d8._M_dataplus._M_p,
                                    local_d8.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::string::find_first_not_of((char)&local_b0,0x20);
                  std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_b0);
                  lVar7 = std::__cxx11::string::find(cVar11,0x20);
                  if (lVar7 == -1) {
LAB_001eae96:
                    paVar10 = &local_f8.field_2;
                    psVar9 = &local_f8._M_string_length;
                    local_f8._M_dataplus._M_p = (pointer)paVar10;
LAB_001eaea5:
                    *psVar9 = 0;
                    paVar10->_M_local_buf[0] = '\0';
                  }
                  else {
                    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_138);
                    std::__cxx11::string::operator=((string *)&local_138,(string *)local_50);
                    if (local_50[0] != local_40) {
                      operator_delete(local_50[0],local_40[0] + 1);
                    }
                    lVar7 = std::__cxx11::string::find_first_not_of(cVar11,0x20);
                    if (lVar7 == -1) goto LAB_001eae96;
                    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_138);
                    std::__cxx11::string::operator=((string *)&local_138,(string *)local_50);
                    if (local_50[0] != local_40) {
                      operator_delete(local_50[0],local_40[0] + 1);
                    }
                    lVar7 = std::__cxx11::string::find(cVar11,0x20);
                    if (lVar7 == -1) {
                      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                      if (local_138 == &local_128) {
                        local_f8.field_2._8_8_ = local_128._8_8_;
                      }
                      else {
                        local_f8._M_dataplus._M_p = (pointer)local_138;
                      }
                      local_f8.field_2._M_allocated_capacity._1_7_ =
                           local_128._M_allocated_capacity._1_7_;
                      local_f8.field_2._M_local_buf[0] = local_128._M_local_buf[0];
                      local_f8._M_string_length = local_130;
                      psVar9 = &local_130;
                      paVar10 = &local_128;
                      local_138 = &local_128;
                      goto LAB_001eaea5;
                    }
                    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_138);
                  }
                  if (local_138 != &local_128) {
                    operator_delete(local_138,
                                    CONCAT71(local_128._M_allocated_capacity._1_7_,
                                             local_128._M_local_buf[0]) + 1);
                  }
                  if (local_b0 != local_a0) {
                    operator_delete(local_b0,local_a0[0] + 1);
                  }
                  skiwi_show_external_primitives(&local_f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                    operator_delete(local_f8._M_dataplus._M_p,
                                    local_f8.field_2._M_allocated_capacity + 1);
                  }
                }
              }
            }
          }
        }
        else if (bVar1 == 0x6d) {
          iVar5 = std::__cxx11::string::compare((char *)&local_158);
          if (iVar5 == 0) {
            skiwi_show_memory();
          }
        }
        else if ((bVar1 == 0x75) &&
                (iVar5 = std::__cxx11::string::compare((char *)&local_158), iVar5 == 0)) {
          skiwi_show_unresolved();
        }
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148._M_allocated_capacity + 1);
      }
    }
    else if (local_118._M_string_length != 0) {
      skiwi_run(&local_118);
    }
    if ((local_b8 & 1) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void skiwi_repl(int argc, char** argv)
  {
  using namespace SKIWI;
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");

  for (int i = 1; i < argc; ++i)
    {
    std::string filename(argv[i]);
    skiwi_runf(filename);
    }

  out(welcome_message);
  std::string input;
  bool quit = false;
  while (!quit)
    {
    out(prompt.c_str());

    std::getline(std::cin, input);

    bool cmd = is_cmd_command(input);
    if (cmd)
      {
      std::string command = get_cleaned_command(input);
      if (command.size() < 2)
        continue;
      switch (command[1])
        {
        case '?':
        {
        if (command == ",?")
          {
          skiwi_show_help();
          }
        break;
        }
        case 'a':
        {
        if (command == ",asm")
          {
          skiwi_show_assembly(input);
          }
        break;
        }
        case 'e':
        {
        if (command == ",env")
          {
          skiwi_show_environment();
          }
        else if (command == ",exit")
          {
          quit = true;
          }
        else if (command == ",expand")
          {
          skiwi_show_expand(input);
          }
        else if (command == ",external")
          {
          std::string arg = get_cleaned_first_argument(input);
          skiwi_show_external_primitives(arg);
          }
        break;
        }
        case 'm':
        {
        if (command == ",mem")
          {
          skiwi_show_memory();
          }
        break;
        }
        case 'u':
        {
        if (command == ",unresolved")
          {
          skiwi_show_unresolved();
          }
        break;
        }
        }
      }
    else if (!input.empty())
      {
      skiwi_run(input);
      }
    }
  }